

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

void mkroom(level *lev,int roomtype)

{
  mkroom *pmVar1;
  bool bVar2;
  byte bVar3;
  int *piVar4;
  int iVar5;
  char *__s2;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  char *__s1;
  long lVar14;
  shclass *psVar15;
  mkroom *croom;
  
  if (0x11 < roomtype) {
    iVar11 = -1;
    if ((flags.debug == '\0') || (__s2 = nh_getenv("SHOPTYPE"), __s2 == (char *)0x0)) {
      bVar3 = 0;
      goto LAB_001e3d43;
    }
    __s1 = "general store";
    psVar15 = shtypes;
    iVar11 = 0;
    do {
      psVar15 = psVar15 + 1;
      iVar5 = strcmp(__s1,__s2);
      bVar3 = 1;
      if ((iVar5 == 0) || (*__s2 == ""[psVar15[-1].symb])) goto LAB_001e3d43;
      __s1 = psVar15->name;
      iVar11 = iVar11 + 1;
    } while (__s1 != (char *)0x0);
    bVar3 = 1;
    switch(*__s2) {
    case 'A':
    case 'a':
switchD_001e3f82_caseD_41:
      iVar11 = 0xd;
LAB_001e3ff2:
      mkzoo(lev,iVar11);
      return;
    case 'B':
    case 'b':
      goto switchD_001e3f82_caseD_42;
    case 'C':
    case 'c':
      goto switchD_001e3f82_caseD_43;
    default:
      iVar11 = -1;
      break;
    case 'G':
    case 'g':
      iVar11 = 0;
      break;
    case 'L':
    case 'l':
      goto switchD_001e3f82_caseD_4c;
    case 'M':
    case 'm':
      goto switchD_001e3f82_caseD_4d;
    case 'O':
    case 'o':
      goto switchD_001e3f82_caseD_4f;
    case 'P':
    case 'p':
      goto switchD_001e3f82_caseD_50;
    case 'R':
    case 'r':
      goto switchD_001e3f82_caseD_52;
    case 'S':
    case 's':
      goto switchD_001e3f82_caseD_53;
    case 'T':
    case 't':
      goto switchD_001e3f82_caseD_54;
    case 'Z':
    case 'z':
      goto switchD_001e3f82_caseD_5a;
    case '_':
      goto switchD_001e3f82_caseD_5f;
    case 'n':
      goto switchD_001e3f82_caseD_6e;
    case '}':
      goto switchD_001e3f82_caseD_7d;
    }
LAB_001e3d43:
    if (-1 < lev->rooms[0].hx) {
      croom = lev->rooms;
      lVar9 = 0;
      do {
        if ((long)lev->nroom <= (lVar9 >> 3) * -0x7b425ed097b425ed) {
          pline("lev->rooms not closed by -1?");
          return;
        }
        if ((croom->rtype != '\0') || (croom == lev->dnstairs_room)) goto LAB_001e3d95;
        if ((lev->sstairs).sx == '\0') {
LAB_001e3de3:
          pmVar1 = lev->upstairs_room;
joined_r0x001e3dea:
          if (croom != pmVar1) {
            if ((bool)(bVar3 & flags.debug != '\0')) {
              if (croom->doorct != '\0') {
LAB_001e3e01:
                if (croom->rlit == '\0') {
                  iVar5 = (int)croom->lx;
                  uVar12 = (uint)croom->hx;
                  if (iVar5 + -1 <= (int)(uVar12 + 1)) {
                    uVar10 = (ulong)(byte)croom->hy;
                    lVar8 = (long)lev + (long)iVar5 * 0xfc + -0xc2;
                    lVar9 = (long)iVar5 + -1;
                    do {
                      iVar5 = (int)croom->ly;
                      if (iVar5 + -1 <= (char)uVar10 + 1) {
                        lVar13 = (long)iVar5 + -2;
                        lVar14 = lVar8 + (long)iVar5 * 0xc;
                        do {
                          *(byte *)(lVar14 + 1) = *(byte *)(lVar14 + 1) | 4;
                          uVar10 = (ulong)croom->hy;
                          lVar13 = lVar13 + 1;
                          lVar14 = lVar14 + 0xc;
                        } while (lVar13 <= (long)uVar10);
                        uVar12 = (uint)(byte)croom->hx;
                      }
                      lVar8 = lVar8 + 0xfc;
                      bVar2 = lVar9 <= (char)uVar12;
                      lVar9 = lVar9 + 1;
                    } while (bVar2);
                  }
                  croom->rlit = '\x01';
                }
                if (iVar11 < 0) {
                  uVar12 = mt_random();
                  iVar11 = -1;
                  piVar4 = &shtypes[0].prob;
                  iVar5 = uVar12 % 100 + 1;
                  do {
                    piVar6 = piVar4;
                    iVar11 = iVar11 + 1;
                    iVar7 = iVar5 - *piVar6;
                    bVar2 = *piVar6 <= iVar5;
                    piVar4 = piVar6 + 0x30;
                    iVar5 = iVar7;
                  } while (iVar7 != 0 && bVar2);
                  if ((0x14 < (((int)croom->hy - (int)croom->ly) + 1) *
                              (((int)croom->hx - (int)croom->lx) + 1)) &&
                     ((*(byte *)(piVar6 + -1) & 0xfe) == 10)) {
                    iVar11 = 0;
                  }
                }
                croom->rtype = (char)iVar11 + '\x12';
                topologize(lev,croom);
                stock_room(iVar11,lev,croom);
                return;
              }
            }
            else if (croom->doorct == '\x01') goto LAB_001e3e01;
          }
        }
        else if ((lev->sstairs).up == '\0') {
          if (croom != lev->sstairs_room) goto LAB_001e3de3;
        }
        else if (croom != lev->upstairs_room) {
          pmVar1 = lev->sstairs_room;
          goto joined_r0x001e3dea;
        }
LAB_001e3d95:
        lVar9 = lVar9 + 0xd8;
        pmVar1 = croom + 1;
        croom = croom + 1;
      } while (-1 < pmVar1->hx);
    }
    return;
  }
  switch(roomtype) {
  case 2:
switchD_001e3f82_caseD_54:
    iVar11 = 2;
    goto LAB_001e3ff2;
  case 3:
switchD_001e3f82_caseD_7d:
    mkswamp(lev);
    return;
  default:
    impossible("Tried to make a room of type %d.");
    return;
  case 5:
switchD_001e3f82_caseD_42:
    iVar11 = 5;
    goto LAB_001e3ff2;
  case 6:
switchD_001e3f82_caseD_4d:
    iVar11 = 6;
    goto LAB_001e3ff2;
  case 7:
switchD_001e3f82_caseD_53:
    iVar11 = 7;
    goto LAB_001e3ff2;
  case 8:
switchD_001e3f82_caseD_5a:
    iVar11 = 8;
    goto LAB_001e3ff2;
  case 10:
switchD_001e3f82_caseD_5f:
    mktemple(lev);
    return;
  case 0xb:
switchD_001e3f82_caseD_4c:
    iVar11 = 0xb;
    goto LAB_001e3ff2;
  case 0xc:
switchD_001e3f82_caseD_43:
    iVar11 = 0xc;
    goto LAB_001e3ff2;
  case 0xd:
    goto switchD_001e3f82_caseD_41;
  case 0xe:
switchD_001e3f82_caseD_6e:
    mkgarden(lev,(mkroom *)0x0);
    return;
  case 0xf:
switchD_001e3f82_caseD_52:
    iVar11 = 0xf;
    goto LAB_001e3ff2;
  case 0x10:
switchD_001e3f82_caseD_50:
    iVar11 = 0x10;
    goto LAB_001e3ff2;
  case 0x11:
switchD_001e3f82_caseD_4f:
    mkpoolroom(lev);
    return;
  }
}

Assistant:

void mkroom(struct level *lev, int roomtype)
{
    if (roomtype >= SHOPBASE)
	mkshop(lev);	/* someday, we should be able to specify shop type */
    else switch(roomtype) {
	case COURT:	mkzoo(lev, COURT); break;
	case ZOO:	mkzoo(lev, ZOO); break;
	case BEEHIVE:	mkzoo(lev, BEEHIVE); break;
	case MORGUE:	mkzoo(lev, MORGUE); break;
	case BARRACKS:	mkzoo(lev, BARRACKS); break;
	case SWAMP:	mkswamp(lev); break;
	case GARDEN:	mkgarden(lev, NULL); break;
	case TEMPLE:	mktemple(lev); break;
	case LEPREHALL:	mkzoo(lev, LEPREHALL); break;
	case COCKNEST:	mkzoo(lev, COCKNEST); break;
	case ARMORY:	mkzoo(lev, ARMORY); break;
	case ANTHOLE:	mkzoo(lev, ANTHOLE); break;
	case LEMUREPIT:	mkzoo(lev, LEMUREPIT); break;
	case POOLROOM:	mkpoolroom(lev); break;
	default:	impossible("Tried to make a room of type %d.", roomtype);
    }
}